

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O2

token * __thiscall
argo::pointer::translate_jsonp_token
          (token *__return_storage_ptr__,pointer *this,string *pointer,size_t *start,size_t *end)

{
  ulong uVar1;
  char cVar2;
  size_t sVar3;
  pointer pcVar4;
  byte bVar5;
  ulong uVar6;
  json_pointer_exception *this_00;
  string translated;
  
  translated._M_dataplus._M_p = (pointer)&translated.field_2;
  translated._M_string_length = 0;
  translated.field_2._M_local_buf[0] = '\0';
  sVar3 = *start;
  uVar6 = sVar3 + 1;
  *start = uVar6;
  if ((pointer->_M_dataplus)._M_p[sVar3] != '/') {
LAB_0011a7cc:
    this_00 = (json_pointer_exception *)__cxa_allocate_exception(0xd8);
    json_pointer_exception::json_pointer_exception
              (this_00,syntax_error_in_pointer_string_e,(int)*start + -1);
    __cxa_throw(this_00,&json_pointer_exception::typeinfo,std::exception::~exception);
  }
  do {
    while( true ) {
      if (*end <= uVar6) {
        make_token(__return_storage_ptr__,this,&translated);
        std::__cxx11::string::~string((string *)&translated);
        return __return_storage_ptr__;
      }
      pcVar4 = (pointer->_M_dataplus)._M_p;
      uVar1 = uVar6 + 1;
      cVar2 = pcVar4[uVar6];
      *start = uVar1;
      if (cVar2 == '~') break;
      this = (pointer *)(ulong)(uint)(int)pcVar4[uVar6];
      std::__cxx11::string::push_back((char)&translated);
      uVar6 = *start;
    }
    if (*end <= uVar1) goto LAB_0011a7cc;
    bVar5 = 0x2f;
    if (pcVar4[uVar1] != '1') {
      if (pcVar4[uVar1] != '0') goto LAB_0011a7cc;
      bVar5 = 0x7e;
    }
    this = (pointer *)(ulong)bVar5;
    std::__cxx11::string::push_back((char)&translated);
    uVar6 = *start + 1;
    *start = uVar6;
  } while( true );
}

Assistant:

pointer::token pointer::translate_jsonp_token(const string &pointer, size_t &start, size_t &end)
{
    string translated;

    if (pointer[start++] == '/')
    {
        while (start < end)
        {
            if (pointer[start] == '~')
            {
                if (++start < end)
                {
                    if (pointer[start] == '0')
                    {
                        translated += '~';
                    }
                    else if (pointer[start] == '1')
                    {
                        translated += '/';
                    }
                    else
                    {
                        throw json_pointer_exception(json_exception::syntax_error_in_pointer_string_e, start - 1);
                    }
                    start++;
                }
                else
                {
                    throw json_pointer_exception(json_exception::syntax_error_in_pointer_string_e, start - 1);
                }
            }
            else
            {
                translated += pointer[start++];
            }
        }

        return make_token(translated);
    }
    else
    {
        throw json_pointer_exception(json_exception::syntax_error_in_pointer_string_e, start - 1);
    }
}